

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O2

void Js::SimpleJitHelpers::ProfileReturnTypeCall
               (void *framePtr,ProfileId profileId,Var retval,JavascriptFunction *callee,
               CallInfo info)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptCallStackLayout *pJVar4;
  FunctionBody *this;
  DynamicProfileInfo *this_00;
  
  if ((info._0_4_ >> 0x19 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SimpleJitProfilingHelpers.cpp"
                                ,0x58,"(info.Flags & CallFlags_Value)",
                                "info.Flags & CallFlags_Value");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pJVar4 = JavascriptCallStackLayout::FromFramePointer(framePtr);
  this = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar4);
  this_00 = FunctionBody::GetDynamicProfileInfo(this);
  DynamicProfileInfo::RecordReturnType(this_00,this,profileId,retval);
  return;
}

Assistant:

void SimpleJitHelpers::ProfileReturnTypeCall(void* framePtr, ProfileId profileId, Var retval, JavascriptFunction*callee, CallInfo info)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleProfileReturnTypeCall);
        Assert(info.Flags & CallFlags_Value);
        JavascriptFunction* caller = JavascriptCallStackLayout::FromFramePointer(framePtr)->functionObject;

        FunctionBody* functionBody = caller->GetFunctionBody();
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        dynamicProfileInfo->RecordReturnType(functionBody, profileId, retval);
        JIT_HELPER_END(SimpleProfileReturnTypeCall);
    }